

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::RenderHeatmap<unsigned_int,ImPlot::TransformerLogLog>
               (TransformerLogLog transformer,ImDrawList *DrawList,uint *values,int rows,int cols,
               double scale_min,double scale_max,char *fmt,ImPlotPoint *bounds_min,
               ImPlotPoint *bounds_max,bool reverse_y)

{
  ImPlotPlot *pIVar1;
  ImVec2 IVar2;
  double dVar3;
  undefined1 auVar4 [16];
  ImPlotContext *pIVar5;
  ImU32 IVar6;
  int iVar7;
  ImPlotPoint *pIVar8;
  int iVar9;
  long lVar10;
  bool bVar11;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  TransformerLogLog transformer_local;
  double local_150;
  ImPlotPoint local_138;
  char *local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  ImVec2 local_f0;
  uint temp_max;
  ImPlotPoint *local_e0;
  int local_d8;
  uint temp_min;
  int local_c0;
  int local_bc;
  int local_b8;
  double local_b0;
  double local_a8;
  undefined1 local_a0 [16];
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double dStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [24];
  ImVec4 color;
  
  pIVar5 = GImPlot;
  transformer_local.YAxis = transformer.YAxis;
  local_128 = fmt;
  if ((((scale_min == 0.0) && (!NAN(scale_min))) && (scale_max == 0.0)) && (!NAN(scale_max))) {
    ImMinMaxArray<unsigned_int>(values,cols * rows,&temp_min,&temp_max);
    scale_min = (double)((ulong)_temp_min & 0xffffffff);
    scale_max = (double)((ulong)_temp_max & 0xffffffff);
  }
  if ((scale_min != scale_max) || (NAN(scale_min) || NAN(scale_max))) {
    if (reverse_y) {
      dVar15 = -1.0;
      pIVar8 = bounds_max;
    }
    else {
      dVar15 = 1.0;
      pIVar8 = bounds_min;
    }
    local_110 = pIVar8->y;
    local_c0 = cols * rows;
    local_90 = bounds_min->x;
    auVar14._0_8_ = bounds_max->x - local_90;
    auVar14._8_8_ = bounds_max->y - bounds_min->y;
    auVar4._8_8_ = (double)rows;
    auVar4._0_8_ = (double)cols;
    local_a0 = divpd(auVar14,auVar4);
    local_78 = local_a0._0_8_ * 0.5;
    dStack_70 = local_a0._8_8_ * 0.5;
    pIVar1 = pIVar5->CurrentPlot;
    iVar7 = pIVar1->CurrentYAxis;
    _temp_min = (ImVec2)values;
    local_bc = rows;
    local_b8 = cols;
    local_b0 = scale_min;
    local_a8 = scale_max;
    local_88 = local_110;
    local_80 = dVar15;
    switch(pIVar5->Scales[iVar7]) {
    case 0:
      local_e0 = &local_138;
      local_138.x = (double)CONCAT44(local_138.x._4_4_,iVar7);
      _temp_max = (ImVec2)&temp_min;
      local_d8 = local_c0;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_int>,ImPlot::TransformerLinLin>>
                ((RectRenderer<ImPlot::GetterHeatmap<unsigned_int>,_ImPlot::TransformerLinLin> *)
                 &temp_max,DrawList,&pIVar1->PlotRect);
      break;
    case 1:
      local_e0 = &local_138;
      local_138.x = (double)CONCAT44(local_138.x._4_4_,iVar7);
      _temp_max = (ImVec2)&temp_min;
      local_d8 = local_c0;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_int>,ImPlot::TransformerLogLin>>
                ((RectRenderer<ImPlot::GetterHeatmap<unsigned_int>,_ImPlot::TransformerLogLin> *)
                 &temp_max,DrawList,&pIVar1->PlotRect);
      break;
    case 2:
      local_e0 = &local_138;
      local_138.x = (double)CONCAT44(local_138.x._4_4_,iVar7);
      _temp_max = (ImVec2)&temp_min;
      local_d8 = local_c0;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_int>,ImPlot::TransformerLinLog>>
                ((RectRenderer<ImPlot::GetterHeatmap<unsigned_int>,_ImPlot::TransformerLinLog> *)
                 &temp_max,DrawList,&pIVar1->PlotRect);
      break;
    case 3:
      local_e0 = &local_138;
      local_138.x = (double)CONCAT44(local_138.x._4_4_,iVar7);
      _temp_max = (ImVec2)&temp_min;
      local_d8 = local_c0;
      RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterHeatmap<unsigned_int>,ImPlot::TransformerLogLog>>
                ((RectRenderer<ImPlot::GetterHeatmap<unsigned_int>,_ImPlot::TransformerLogLog> *)
                 &temp_max,DrawList,&pIVar1->PlotRect);
    }
    if (local_128 != (char *)0x0) {
      local_100 = (bounds_max->x - bounds_min->x) / (double)cols;
      local_118 = (bounds_max->y - bounds_min->y) / (double)rows;
      if (cols < 1) {
        cols = 0;
      }
      if (rows < 1) {
        rows = 0;
      }
      local_120 = local_118 * 0.5;
      local_108 = local_100 * 0.5;
      lVar10 = 0;
      local_150 = 0.0;
      for (iVar7 = 0; iVar7 != rows; iVar7 = iVar7 + 1) {
        local_f8 = (local_118 * local_150 + local_120) * dVar15 + local_110;
        lVar10 = (long)(int)lVar10;
        dVar12 = 0.0;
        iVar9 = cols;
        while (bVar11 = iVar9 != 0, iVar9 = iVar9 + -1, bVar11) {
          local_138.x = dVar12 * local_100 + bounds_min->x + local_108;
          local_138.y = local_f8;
          IVar2 = TransformerLogLog::operator()(&transformer_local,&local_138);
          local_58._8_4_ = extraout_XMM0_Dc;
          local_58._0_4_ = IVar2.x;
          local_58._4_4_ = IVar2.y;
          local_58._12_4_ = extraout_XMM0_Dd;
          sprintf((char *)&temp_max,local_128,(ulong)values[lVar10]);
          IVar2 = ImGui::CalcTextSize((char *)&temp_max,(char *)0x0,false,-1.0);
          local_68._8_4_ = extraout_XMM0_Dc_00;
          local_68._0_4_ = IVar2.x;
          local_68._4_4_ = IVar2.y;
          local_68._12_4_ = extraout_XMM0_Dd_00;
          dVar3 = ((double)values[lVar10] - scale_min) / (scale_max - scale_min);
          dVar13 = 1.0;
          if (dVar3 <= 1.0) {
            dVar13 = dVar3;
          }
          color = SampleColormap((float)(double)(~-(ulong)(dVar3 < 0.0) & (ulong)dVar13),-1);
          IVar6 = CalcTextColor(&color);
          local_f0.y = (float)local_68._4_4_ * -0.5 + (float)local_58._4_4_;
          local_f0.x = (float)local_68._0_4_ * -0.5 + (float)local_58._0_4_;
          ImDrawList::AddText(DrawList,&local_f0,IVar6,(char *)&temp_max,(char *)0x0);
          lVar10 = lVar10 + 1;
          dVar12 = dVar12 + 1.0;
        }
        local_150 = local_150 + 1.0;
      }
    }
  }
  else {
    _temp_min = TransformerLogLog::operator()(&transformer_local,bounds_min);
    _temp_max = TransformerLogLog::operator()(&transformer_local,bounds_max);
    IVar6 = GetColormapColorU32(0,(pIVar5->Style).Colormap);
    ImDrawList::AddRectFilled(DrawList,(ImVec2 *)&temp_min,(ImVec2 *)&temp_max,IVar6,0.0,0);
  }
  return;
}

Assistant:

void RenderHeatmap(Transformer transformer, ImDrawList& DrawList, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max, bool reverse_y) {
    ImPlotContext& gp = *GImPlot;
    if (scale_min == 0 && scale_max == 0) {
        T temp_min, temp_max;
        ImMinMaxArray(values,rows*cols,&temp_min,&temp_max);
        scale_min = (double)temp_min;
        scale_max = (double)temp_max;
    }
    if (scale_min == scale_max) {
        ImVec2 a = transformer(bounds_min);
        ImVec2 b = transformer(bounds_max);
        ImU32  col = GetColormapColorU32(0,gp.Style.Colormap);
        DrawList.AddRectFilled(a, b, col);
        return;
    }
    const double yref = reverse_y ? bounds_max.y : bounds_min.y;
    const double ydir = reverse_y ? -1 : 1;
    GetterHeatmap<T> getter(values, rows, cols, scale_min, scale_max, (bounds_max.x - bounds_min.x) / cols, (bounds_max.y - bounds_min.y) / rows, bounds_min.x, yref, ydir);
    switch (GetCurrentScale()) {
        case ImPlotScale_LinLin: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLinLin>(getter, TransformerLinLin()), DrawList, gp.CurrentPlot->PlotRect); break;
        case ImPlotScale_LogLin: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLogLin>(getter, TransformerLogLin()), DrawList, gp.CurrentPlot->PlotRect); break;;
        case ImPlotScale_LinLog: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLinLog>(getter, TransformerLinLog()), DrawList, gp.CurrentPlot->PlotRect); break;;
        case ImPlotScale_LogLog: RenderPrimitives(RectRenderer<GetterHeatmap<T>, TransformerLogLog>(getter, TransformerLogLog()), DrawList, gp.CurrentPlot->PlotRect); break;;
    }
    if (fmt != NULL) {
        const double w = (bounds_max.x - bounds_min.x) / cols;
        const double h = (bounds_max.y - bounds_min.y) / rows;
        const ImPlotPoint half_size(w*0.5,h*0.5);
        int i = 0;
        for (int r = 0; r < rows; ++r) {
            for (int c = 0; c < cols; ++c) {
                ImPlotPoint p;
                p.x = bounds_min.x + 0.5*w + c*w;
                p.y = yref + ydir * (0.5*h + r*h);
                ImVec2 px = transformer(p);
                char buff[32];
                sprintf(buff, fmt, values[i]);
                ImVec2 size = ImGui::CalcTextSize(buff);
                double t = ImClamp(ImRemap01((double)values[i], scale_min, scale_max),0.0,1.0);
                ImVec4 color = SampleColormap((float)t);
                ImU32 col = CalcTextColor(color);
                DrawList.AddText(px - size * 0.5f, col, buff);
                i++;
            }
        }
    }
}